

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
::ReadNumArgs(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
              *this,int min_args)

{
  int iVar1;
  
  iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (iVar1 < min_args) {
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x21278e);
  }
  return iVar1;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }